

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined4 uVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  NodeRef nodeRef;
  size_t sVar8;
  size_t sVar9;
  Primitive_conflict4 *prim;
  byte bVar10;
  NodeRef *pNVar11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  vint4 ai_2;
  vint4 ai;
  undefined1 auVar31 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  vint4 ai_3;
  vint4 bi;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 bi_1;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi_3;
  undefined1 auVar36 [16];
  vint4 bi_2;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  vbool<4>_conflict valid0;
  InstanceArrayIntersectorK<4> local_357a;
  Precalculations pre;
  int local_3528;
  int iStack_3524;
  int iStack_3520;
  int iStack_351c;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar21 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar24 = ZEXT816(0) << 0x40;
    uVar7 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar24,5);
    uVar16 = vpcmpeqd_avx512vl(auVar21,(undefined1  [16])valid_i->field_0);
    uVar16 = ((byte)uVar7 & 0xf) & uVar16;
    bVar15 = (byte)uVar16;
    if (bVar15 != 0) {
      auVar21 = *(undefined1 (*) [16])(ray + 0x40);
      auVar23 = *(undefined1 (*) [16])(ray + 0x50);
      auVar39 = *(undefined1 (*) [16])(ray + 0x60);
      auVar29._8_4_ = 0x7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx(auVar21,auVar29);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      uVar17 = vcmpps_avx512vl(auVar18,auVar32,1);
      bVar14 = (bool)((byte)uVar17 & 1);
      auVar18._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._0_4_;
      bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar18._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._4_4_;
      bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar18._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._8_4_;
      bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar18._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._12_4_;
      auVar21 = vandps_avx(auVar39,auVar29);
      uVar17 = vcmpps_avx512vl(auVar21,auVar32,1);
      bVar14 = (bool)((byte)uVar17 & 1);
      auVar21._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar39._0_4_;
      bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar21._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar39._4_4_;
      bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar21._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar39._8_4_;
      bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar21._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar39._12_4_;
      auVar19 = vrcp14ps_avx512vl(auVar18);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = &DAT_3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar39 = vfnmadd213ps_fma(auVar18,auVar19,auVar34);
      auVar20 = vrcp14ps_avx512vl(auVar21);
      auVar18 = vfnmadd213ps_fma(auVar21,auVar20,auVar34);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar42 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar21 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar24);
      stack_near[1].field_0._0_4_ =
           (uint)(bVar15 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar15 & 1) * 0x7f800000;
      bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
      stack_near[1].field_0._4_4_ = (uint)bVar14 * auVar21._4_4_ | (uint)!bVar14 * 0x7f800000;
      bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
      stack_near[1].field_0._8_4_ = (uint)bVar14 * auVar21._8_4_ | (uint)!bVar14 * 0x7f800000;
      bVar14 = SUB81(uVar16 >> 3,0);
      stack_near[1].field_0._12_4_ = (uint)bVar14 * auVar21._12_4_ | (uint)!bVar14 * 0x7f800000;
      auVar43 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      auVar21 = *(undefined1 (*) [16])ray;
      auVar25._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
      auVar25._8_4_ = auVar21._8_4_ ^ 0x80000000;
      auVar25._12_4_ = auVar21._12_4_ ^ 0x80000000;
      auVar21 = *(undefined1 (*) [16])(ray + 0x20);
      auVar31._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
      auVar31._8_4_ = auVar21._8_4_ ^ 0x80000000;
      auVar31._12_4_ = auVar21._12_4_ ^ 0x80000000;
      auVar21 = vandps_avx(auVar23,auVar29);
      uVar17 = vcmpps_avx512vl(auVar21,auVar32,1);
      bVar14 = (bool)((byte)uVar17 & 1);
      auVar22._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar23._0_4_;
      bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar23._4_4_;
      bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar23._8_4_;
      bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar23._12_4_;
      auVar23 = vrcp14ps_avx512vl(auVar22);
      auVar21 = vfnmadd213ps_fma(auVar22,auVar23,auVar34);
      auVar21 = vfmadd132ps_fma(auVar21,auVar23,auVar23);
      auVar40 = ZEXT1664(auVar21);
      auVar24 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar24);
      bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
      bVar5 = SUB81(uVar16 >> 3,0);
      auVar44 = ZEXT1664(CONCAT412((uint)bVar5 * auVar24._12_4_ | (uint)!bVar5 * -0x800000,
                                   CONCAT48((uint)bVar13 * auVar24._8_4_ | (uint)!bVar13 * -0x800000
                                            ,CONCAT44((uint)bVar14 * auVar24._4_4_ |
                                                      (uint)!bVar14 * -0x800000,
                                                      (uint)(bVar15 & 1) * auVar24._0_4_ |
                                                      (uint)!(bool)(bVar15 & 1) * -0x800000))));
      auVar24 = vfmadd132ps_fma(auVar39,auVar19,auVar19);
      auVar38 = ZEXT1664(auVar24);
      auVar23 = vfmadd132ps_fma(auVar18,auVar20,auVar20);
      auVar41 = ZEXT1664(auVar23);
      bVar10 = (byte)((ushort)((short)uVar16 << 0xc) >> 0xc) ^ 0xf;
      pNVar11 = stack_node + 2;
      paVar12 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      auVar24 = vmulps_avx512vl(auVar24,auVar25);
      auVar45 = ZEXT1664(auVar24);
      auVar37 = ZEXT1664(CONCAT412(auVar21._12_4_ * -*(float *)(ray + 0x1c),
                                   CONCAT48(auVar21._8_4_ * -*(float *)(ray + 0x18),
                                            CONCAT44(auVar21._4_4_ * -*(float *)(ray + 0x14),
                                                     auVar21._0_4_ * -*(float *)(ray + 0x10)))));
      auVar21 = vmulps_avx512vl(auVar23,auVar31);
      auVar46 = ZEXT1664(auVar21);
LAB_008278e2:
      paVar12 = paVar12 + -1;
      pNVar1 = pNVar11 + -1;
      pNVar11 = pNVar11 + -1;
      bVar14 = true;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        auVar30 = ZEXT1664((undefined1  [16])*paVar12);
        auVar21 = auVar44._0_16_;
        uVar7 = vcmpps_avx512vl((undefined1  [16])*paVar12,auVar21,1);
        sVar8 = pNVar1->ptr;
        if ((char)uVar7 != '\0') {
          do {
            auVar23 = auVar38._0_16_;
            auVar20 = auVar45._0_16_;
            auVar24 = auVar37._0_16_;
            auVar39 = auVar40._0_16_;
            auVar18 = auVar41._0_16_;
            auVar22 = auVar46._0_16_;
            auVar19 = auVar43._0_16_;
            if ((sVar8 & 8) != 0) {
              if (sVar8 == 0xfffffffffffffff8) goto LAB_00827a27;
              uVar7 = vcmpps_avx512vl(auVar21,auVar30._0_16_,6);
              if ((char)uVar7 != '\0') {
                uVar16 = (ulong)((uint)sVar8 & 0xf);
                valid0.v = ~bVar10 & 0xf;
                if (uVar16 == 8) goto LAB_00827b03;
                prim = (Primitive_conflict4 *)(sVar8 & 0xfffffffffffffff0);
                uVar17 = 1;
                goto LAB_00827abd;
              }
              break;
            }
            auVar30 = ZEXT1664(auVar42._0_16_);
            uVar16 = 0;
            sVar9 = 8;
            do {
              sVar3 = *(size_t *)((sVar8 & 0xfffffffffffffff0) + uVar16 * 8);
              if (sVar3 != 8) {
                uVar2 = *(undefined4 *)(sVar8 + 0x40 + uVar16 * 4);
                auVar26._4_4_ = uVar2;
                auVar26._0_4_ = uVar2;
                auVar26._8_4_ = uVar2;
                auVar26._12_4_ = uVar2;
                auVar25 = vfmadd132ps_avx512vl(auVar26,auVar20,auVar23);
                uVar2 = *(undefined4 *)(sVar8 + 0x80 + uVar16 * 4);
                auVar27._4_4_ = uVar2;
                auVar27._0_4_ = uVar2;
                auVar27._8_4_ = uVar2;
                auVar27._12_4_ = uVar2;
                auVar32 = vfmadd132ps_fma(auVar27,auVar24,auVar39);
                uVar2 = *(undefined4 *)(sVar8 + 0xc0 + uVar16 * 4);
                auVar28._4_4_ = uVar2;
                auVar28._0_4_ = uVar2;
                auVar28._8_4_ = uVar2;
                auVar28._12_4_ = uVar2;
                auVar26 = vfmadd132ps_avx512vl(auVar28,auVar22,auVar18);
                uVar2 = *(undefined4 *)(sVar8 + 0x60 + uVar16 * 4);
                auVar33._4_4_ = uVar2;
                auVar33._0_4_ = uVar2;
                auVar33._8_4_ = uVar2;
                auVar33._12_4_ = uVar2;
                auVar27 = vfmadd132ps_avx512vl(auVar33,auVar20,auVar23);
                uVar2 = *(undefined4 *)(sVar8 + 0xa0 + uVar16 * 4);
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
                auVar34 = vfmadd132ps_fma(auVar35,auVar24,auVar39);
                uVar2 = *(undefined4 *)(sVar8 + 0xe0 + uVar16 * 4);
                auVar36._4_4_ = uVar2;
                auVar36._0_4_ = uVar2;
                auVar36._8_4_ = uVar2;
                auVar36._12_4_ = uVar2;
                auVar28 = vfmadd132ps_avx512vl(auVar36,auVar22,auVar18);
                auVar31 = vpminsd_avx(auVar25,auVar27);
                auVar29 = vpminsd_avx(auVar32,auVar34);
                auVar31 = vpmaxsd_avx(auVar31,auVar29);
                auVar29 = vpminsd_avx(auVar26,auVar28);
                auVar31 = vpmaxsd_avx(auVar31,auVar29);
                auVar29 = vpmaxsd_avx(auVar25,auVar27);
                auVar32 = vpmaxsd_avx(auVar32,auVar34);
                auVar34 = vpminsd_avx(auVar29,auVar32);
                auVar29 = vpmaxsd_avx(auVar26,auVar28);
                auVar32 = vpmaxsd_avx(auVar31,auVar19);
                auVar29 = vpminsd_avx512vl(auVar29,auVar21);
                auVar29 = vpminsd_avx(auVar34,auVar29);
                uVar17 = vpcmpd_avx512vl(auVar32,auVar29,2);
                uVar17 = uVar17 & 0xf;
                if ((byte)uVar17 != 0) {
                  auVar29 = vblendmps_avx512vl(auVar42._0_16_,auVar31);
                  bVar13 = (bool)((byte)uVar17 & 1);
                  bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
                  bVar6 = SUB81(uVar17 >> 3,0);
                  if (sVar9 != 8) {
                    pNVar11->ptr = sVar9;
                    pNVar11 = pNVar11 + 1;
                    *paVar12 = auVar30._0_16_;
                    paVar12 = paVar12 + 1;
                  }
                  auVar30 = ZEXT1664(CONCAT412((uint)bVar6 * auVar29._12_4_ |
                                               (uint)!bVar6 * auVar31._12_4_,
                                               CONCAT48((uint)bVar4 * auVar29._8_4_ |
                                                        (uint)!bVar4 * auVar31._8_4_,
                                                        CONCAT44((uint)bVar5 * auVar29._4_4_ |
                                                                 (uint)!bVar5 * auVar31._4_4_,
                                                                 (uint)bVar13 * auVar29._0_4_ |
                                                                 (uint)!bVar13 * auVar31._0_4_))));
                  sVar9 = sVar3;
                }
              }
            } while ((sVar3 != 8) && (bVar13 = uVar16 < 7, uVar16 = uVar16 + 1, bVar13));
            sVar8 = sVar9;
          } while (sVar9 != 8);
        }
        bVar14 = false;
      }
      goto LAB_00827a27;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar14 = uVar16 - 8 <= uVar17;
    uVar17 = uVar17 + 1;
    if (bVar14) break;
LAB_00827abd:
    InstanceArrayIntersectorK<4>::occluded(&local_357a,&valid0,&pre,ray,context,prim);
    valid0.v = ~(byte)local_357a & valid0.v & 0xf;
    if (valid0.v == 0) break;
  }
LAB_00827b03:
  bVar10 = bVar10 | ~valid0.v & 0xf;
  if (bVar10 == 0xf) {
    auVar38 = ZEXT1664(auVar23);
    auVar40 = ZEXT1664(auVar39);
    auVar41 = ZEXT1664(auVar18);
    auVar42 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar43 = ZEXT1664(auVar19);
    auVar44 = ZEXT1664(auVar21);
    auVar45 = ZEXT1664(auVar20);
    auVar37 = ZEXT1664(auVar24);
    auVar46 = ZEXT1664(auVar22);
    bVar14 = true;
  }
  else {
    local_3528 = auVar44._0_4_;
    iStack_3524 = auVar44._4_4_;
    iStack_3520 = auVar44._8_4_;
    iStack_351c = auVar44._12_4_;
    auVar21 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    bVar14 = (bool)(bVar10 >> 1 & 1);
    bVar13 = (bool)(bVar10 >> 2 & 1);
    auVar44 = ZEXT1664(CONCAT412((uint)(bVar10 >> 3) * auVar21._12_4_ |
                                 (uint)!(bool)(bVar10 >> 3) * iStack_351c,
                                 CONCAT48((uint)bVar13 * auVar21._8_4_ | (uint)!bVar13 * iStack_3520
                                          ,CONCAT44((uint)bVar14 * auVar21._4_4_ |
                                                    (uint)!bVar14 * iStack_3524,
                                                    (uint)(bVar10 & 1) * auVar21._0_4_ |
                                                    (uint)!(bool)(bVar10 & 1) * local_3528))));
    bVar14 = false;
    auVar38 = ZEXT1664(auVar23);
    auVar40 = ZEXT1664(auVar39);
    auVar41 = ZEXT1664(auVar18);
    auVar42 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar43 = ZEXT1664(auVar19);
    auVar45 = ZEXT1664(auVar20);
    auVar37 = ZEXT1664(auVar24);
    auVar46 = ZEXT1664(auVar22);
  }
LAB_00827a27:
  if (bVar14) {
    bVar10 = bVar10 & bVar15;
    bVar14 = (bool)(bVar10 >> 1 & 1);
    bVar13 = (bool)(bVar10 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar10 & 1) * -0x800000 | (uint)!(bool)(bVar10 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar14 * -0x800000 | (uint)!bVar14 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar13 * -0x800000 | (uint)!bVar13 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar10 >> 3) * -0x800000 | (uint)!(bool)(bVar10 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_008278e2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }